

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11::detail::clear_patients(PyObject *self)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
  this;
  iterator this_00;
  reference pp_Var2;
  long in_RDI;
  PyObject *_py_tmp;
  PyObject **patient;
  iterator __end2;
  iterator __begin2;
  type *__range2;
  type patients;
  iterator pos;
  internals *internals;
  instance *instance;
  unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
  *in_stack_ffffffffffffff78;
  _object *in_stack_ffffffffffffff80;
  _Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
  in_stack_ffffffffffffff88;
  __normal_iterator<_object_**,_std::vector<_object_*,_std::allocator<_object_*>_>_> local_68;
  undefined1 *local_60;
  _Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
  local_58;
  __node_type *local_40;
  undefined1 local_38 [24];
  _Node_iterator_base<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false>
  local_20;
  internals *local_18;
  long local_10;
  
  local_10 = in_RDI;
  local_18 = get_internals();
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x26ab2f);
  std::__detail::
  _Node_iterator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false,_false>
  ::operator->((_Node_iterator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>,_false,_false>
                *)0x26ab3e);
  std::vector<_object_*,_std::allocator<_object_*>_>::vector
            ((vector<_object_*,_std::allocator<_object_*>_> *)in_stack_ffffffffffffff80,
             (vector<_object_*,_std::allocator<_object_*>_> *)in_stack_ffffffffffffff78);
  local_40 = local_20._M_cur;
  this._M_cur = (__node_type *)
                std::
                unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
                ::erase((unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
                         *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff88._M_cur);
  *(byte *)(local_10 + 0x30) = *(byte *)(local_10 + 0x30) & 0xef;
  local_60 = local_38;
  local_58._M_cur = this._M_cur;
  local_68._M_current =
       (_object **)
       std::vector<_object_*,_std::allocator<_object_*>_>::begin
                 ((vector<_object_*,_std::allocator<_object_*>_> *)this._M_cur);
  this_00 = std::vector<_object_*,_std::allocator<_object_*>_>::end
                      ((vector<_object_*,_std::allocator<_object_*>_> *)this._M_cur);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<_object_**,_std::vector<_object_*,_std::allocator<_object_*>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<_object_**,_std::vector<_object_*,_std::allocator<_object_*>_>_>
                        *)this._M_cur);
    if (!bVar1) break;
    pp_Var2 = __gnu_cxx::
              __normal_iterator<_object_**,_std::vector<_object_*,_std::allocator<_object_*>_>_>::
              operator*(&local_68);
    in_stack_ffffffffffffff80 = *pp_Var2;
    if (in_stack_ffffffffffffff80 != (_object *)0x0) {
      *pp_Var2 = (_object *)0x0;
      _Py_DECREF((PyObject *)0x26ac06);
    }
    __gnu_cxx::__normal_iterator<_object_**,_std::vector<_object_*,_std::allocator<_object_*>_>_>::
    operator++(&local_68);
  }
  std::vector<_object_*,_std::allocator<_object_*>_>::~vector
            ((vector<_object_*,_std::allocator<_object_*>_> *)this_00._M_current);
  return;
}

Assistant:

inline void clear_patients(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);
    auto &internals = get_internals();
    auto pos = internals.patients.find(self);
    assert(pos != internals.patients.end());
    // Clearing the patients can cause more Python code to run, which
    // can invalidate the iterator. Extract the vector of patients
    // from the unordered_map first.
    auto patients = std::move(pos->second);
    internals.patients.erase(pos);
    instance->has_patients = false;
    for (PyObject *&patient : patients)
        Py_CLEAR(patient);
}